

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

int deqp::gles2::Functional::getNumSamplersInType(VarType *type)

{
  bool bVar1;
  DataType dataType;
  int iVar2;
  int iVar3;
  StructType *this;
  StructMember *this_00;
  VarType *pVVar4;
  int local_28;
  uint local_24;
  int i;
  int sum;
  StructType *structType;
  VarType *type_local;
  
  bVar1 = glu::VarType::isBasicType(type);
  if (bVar1) {
    dataType = glu::VarType::getBasicType(type);
    bVar1 = glu::isDataTypeSampler(dataType);
    type_local._4_4_ = (uint)bVar1;
  }
  else {
    bVar1 = glu::VarType::isArrayType(type);
    if (bVar1) {
      pVVar4 = glu::VarType::getElementType(type);
      iVar3 = getNumSamplersInType(pVVar4);
      iVar2 = glu::VarType::getArraySize(type);
      type_local._4_4_ = iVar3 * iVar2;
    }
    else {
      this = glu::VarType::getStructPtr(type);
      local_24 = 0;
      for (local_28 = 0; iVar3 = glu::StructType::getNumMembers(this), local_28 < iVar3;
          local_28 = local_28 + 1) {
        this_00 = glu::StructType::getMember(this,local_28);
        pVVar4 = glu::StructMember::getType(this_00);
        iVar3 = getNumSamplersInType(pVVar4);
        local_24 = iVar3 + local_24;
      }
      type_local._4_4_ = local_24;
    }
  }
  return type_local._4_4_;
}

Assistant:

static int getNumSamplersInType (const glu::VarType& type)
{
	if (type.isBasicType())
		return glu::isDataTypeSampler(type.getBasicType()) ? 1 : 0;
	else if (type.isArrayType())
		return getNumSamplersInType(type.getElementType()) * type.getArraySize();
	else
	{
		DE_ASSERT(type.isStructType());
		const StructType& structType = *type.getStructPtr();
		int sum = 0;
		for (int i = 0; i < structType.getNumMembers(); i++)
			sum += getNumSamplersInType(structType.getMember(i).getType());
		return sum;
	}
}